

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

void monster_group_start(chunk_conflict *c,monster *mon,wchar_t which)

{
  monster_group *pmVar1;
  mon_group_list_entry *pmVar2;
  ulong uVar3;
  wchar_t wVar4;
  
  pmVar1 = (monster_group *)mem_zalloc(0x10);
  wVar4 = L'\0';
  if (1 < (ulong)z_info->level_monster_max) {
    uVar3 = 1;
    do {
      if (c->monster_groups[uVar3] == (monster_group *)0x0) {
        wVar4 = (wchar_t)uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (z_info->level_monster_max != uVar3);
  }
  if (wVar4 == L'\0') {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-group.c"
                  ,0xf8,"void monster_group_start(struct chunk *, struct monster *, int)");
  }
  c->monster_groups[wVar4] = pmVar1;
  pmVar1->index = wVar4;
  pmVar1->leader = mon->midx;
  pmVar2 = (mon_group_list_entry *)mem_zalloc(0x10);
  pmVar1->member_list = pmVar2;
  pmVar2->midx = mon->midx;
  mon->group_info[which].index = wVar4;
  mon->group_info[which].role = MON_GROUP_LEADER;
  return;
}

Assistant:

void monster_group_start(struct chunk *c, struct monster *mon, int which)
{
	/* Get a group and a group index */
	struct monster_group *group = monster_group_new();
	int index = monster_group_index_new(c);
	assert(index);

	/* Put the group in the group list */
	c->monster_groups[index] = group;

	/* Fill out the group */
	group->index = index;
	group->leader = mon->midx;
	group->member_list = mem_zalloc(sizeof(struct mon_group_list_entry));
	group->member_list->midx = mon->midx;

	/* Write the index to the monster's group info, make it leader */
	mon->group_info[which].index = index;
	mon->group_info[which].role = MON_GROUP_LEADER;
}